

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *in,QByteArray *ba)

{
  qint64 qVar1;
  char *pcVar2;
  qint64 qVar3;
  long len;
  Status status;
  long lVar4;
  long size;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char>::clear(&ba->d);
  qVar1 = QDataStream::readQSizeType(in);
  if (qVar1 < -1) {
    QArrayDataPointer<char>::clear(&ba->d);
    status = SizeLimitExceeded;
LAB_002d2eff:
    QDataStream::setStatus(in,status);
  }
  else if (qVar1 == -1) {
    local_58.d = (ba->d).d;
    local_58.ptr = (ba->d).ptr;
    (ba->d).d = (Data *)0x0;
    (ba->d).ptr = (char *)0x0;
    local_58.size = (ba->d).size;
    (ba->d).size = 0;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
  else {
    lVar4 = 0;
    do {
      len = qVar1 - lVar4;
      if (0xfffff < len) {
        len = 0x100000;
      }
      size = lVar4 + len;
      QByteArray::resize(ba,size);
      pcVar2 = QByteArray::data(ba);
      qVar3 = QDataStream::readRawData(in,pcVar2 + lVar4,len);
      if (qVar3 != len) {
        QArrayDataPointer<char>::clear(&ba->d);
        status = ReadPastEnd;
        goto LAB_002d2eff;
      }
      lVar4 = size;
    } while (size < qVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QByteArray &ba)
{
    ba.clear();

    qint64 size = QDataStream::readQSizeType(in);
    qsizetype len = size;
    if (size != len || size < -1) {
        ba.clear();
        in.setStatus(QDataStream::SizeLimitExceeded);
        return in;
    }
    if (len == -1) { // null byte-array
        ba = QByteArray();
        return in;
    }

    constexpr qsizetype Step = 1024 * 1024;
    qsizetype allocated = 0;

    do {
        qsizetype blockSize = qMin(Step, len - allocated);
        ba.resize(allocated + blockSize);
        if (in.readRawData(ba.data() + allocated, blockSize) != blockSize) {
            ba.clear();
            in.setStatus(QDataStream::ReadPastEnd);
            return in;
        }
        allocated += blockSize;
    } while (allocated < len);

    return in;
}